

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall
wabt::(anonymous_namespace)::WatWriter::
WriteTypeBindings<std::vector<wabt::Type,std::allocator<wabt::Type>>>
          (WatWriter *this,char *prefix,vector<wabt::Type,_std::allocator<wabt::Type>_> *types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *index_to_name,Index binding_index_offset)

{
  Type type_00;
  bool bVar1;
  bool bVar2;
  byte bVar3;
  reference pTVar4;
  const_reference str;
  size_type sVar5;
  bool has_name;
  string *name;
  Type type;
  const_iterator __end0;
  const_iterator __begin0;
  vector<wabt::Type,_std::allocator<wabt::Type>_> *__range2;
  size_t index;
  bool prev_has_name;
  bool first;
  Index binding_index_offset_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *index_to_name_local;
  vector<wabt::Type,_std::allocator<wabt::Type>_> *types_local;
  char *prefix_local;
  WatWriter *this_local;
  
  bVar1 = true;
  index._2_1_ = 0;
  __range2 = (vector<wabt::Type,_std::allocator<wabt::Type>_> *)0x0;
  __end0 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::begin(types);
  type = (Type)std::vector<wabt::Type,_std::allocator<wabt::Type>_>::end(types);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_wabt::Type_*,_std::vector<wabt::Type,_std::allocator<wabt::Type>_>_>
                                *)&type);
    if (!bVar2) break;
    pTVar4 = __gnu_cxx::
             __normal_iterator<const_wabt::Type_*,_std::vector<wabt::Type,_std::allocator<wabt::Type>_>_>
             ::operator*(&__end0);
    type_00 = *pTVar4;
    str = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](index_to_name,
                       (long)&(__range2->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                              )._M_impl.super__Vector_impl_data._M_start +
                       (ulong)binding_index_offset);
    bVar3 = std::__cxx11::string::empty();
    bVar3 = (bVar3 ^ 0xff) & 1;
    if (((bVar3 != 0) || (index._2_1_ != 0)) && (!bVar1)) {
      anon_unknown_1::WatWriter::WriteCloseSpace((WatWriter *)this);
    }
    if (((bVar3 != 0) || (index._2_1_ != 0)) || (bVar1)) {
      anon_unknown_1::WatWriter::WriteOpenSpace((WatWriter *)this,prefix);
    }
    if (bVar3 != 0) {
      anon_unknown_1::WatWriter::WriteString((WatWriter *)this,str,Space);
    }
    anon_unknown_1::WatWriter::WriteType((WatWriter *)this,type_00,Space);
    bVar1 = false;
    __range2 = (vector<wabt::Type,_std::allocator<wabt::Type>_> *)
               ((long)&(__range2->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                       _M_impl.super__Vector_impl_data._M_start + 1);
    __gnu_cxx::
    __normal_iterator<const_wabt::Type_*,_std::vector<wabt::Type,_std::allocator<wabt::Type>_>_>::
    operator++(&__end0);
    index._2_1_ = bVar3;
  }
  sVar5 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(types);
  if (sVar5 != 0) {
    anon_unknown_1::WatWriter::WriteCloseSpace((WatWriter *)this);
  }
  return;
}

Assistant:

void WatWriter::WriteTypeBindings(const char* prefix,
                                  const T& types,
                                  const std::vector<std::string>& index_to_name,
                                  Index binding_index_offset) {
  /* named params/locals must be specified by themselves, but nameless
   * params/locals can be compressed, e.g.:
   *   (param $foo i32)
   *   (param i32 i64 f32)
   */
  bool first = true;
  bool prev_has_name = false;
  size_t index = 0;
  for (Type type : types) {
    const std::string& name = index_to_name[binding_index_offset + index];
    bool has_name = !name.empty();
    if ((has_name || prev_has_name) && !first) {
      WriteCloseSpace();
    }
    if (has_name || prev_has_name || first) {
      WriteOpenSpace(prefix);
    }
    if (has_name) {
      WriteString(name, NextChar::Space);
    }
    WriteType(type, NextChar::Space);
    prev_has_name = has_name;
    first = false;
    ++index;
  }
  if (types.size() != 0) {
    WriteCloseSpace();
  }
}